

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

void reuse_conn(Curl_easy *data,connectdata *old_conn,connectdata *conn)

{
  undefined1 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  int local_port;
  char local_ip [46];
  int local_6c;
  char local_68 [56];
  
  local_68[0x20] = '\0';
  local_68[0x21] = '\0';
  local_68[0x22] = '\0';
  local_68[0x23] = '\0';
  local_68[0x24] = '\0';
  local_68[0x25] = '\0';
  local_68[0x26] = '\0';
  local_68[0x27] = '\0';
  local_68[0x28] = '\0';
  local_68[0x29] = '\0';
  local_68[0x2a] = '\0';
  local_68[0x2b] = '\0';
  local_68[0x2c] = '\0';
  local_68[0x2d] = '\0';
  local_68[0x10] = '\0';
  local_68[0x11] = '\0';
  local_68[0x12] = '\0';
  local_68[0x13] = '\0';
  local_68[0x14] = '\0';
  local_68[0x15] = '\0';
  local_68[0x16] = '\0';
  local_68[0x17] = '\0';
  local_68[0x18] = '\0';
  local_68[0x19] = '\0';
  local_68[0x1a] = '\0';
  local_68[0x1b] = '\0';
  local_68[0x1c] = '\0';
  local_68[0x1d] = '\0';
  local_68[0x1e] = '\0';
  local_68[0x1f] = '\0';
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\0';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = '\0';
  local_6c = -1;
  if (old_conn->user != (char *)0x0) {
    (*Curl_cfree)(conn->user);
    conn->user = (char *)0x0;
    (*Curl_cfree)(conn->passwd);
    conn->passwd = (char *)0x0;
    conn->user = old_conn->user;
    conn->passwd = old_conn->passwd;
    old_conn->user = (char *)0x0;
    old_conn->passwd = (char *)0x0;
  }
  uVar12 = *(uint *)&(old_conn->bits).field_0x4 & 4;
  *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffffffb | uVar12;
  if (uVar12 != 0) {
    (*Curl_cfree)((conn->http_proxy).user);
    (conn->http_proxy).user = (char *)0x0;
    (*Curl_cfree)((conn->socks_proxy).user);
    (conn->socks_proxy).user = (char *)0x0;
    (*Curl_cfree)((conn->http_proxy).passwd);
    (conn->http_proxy).passwd = (char *)0x0;
    (*Curl_cfree)((conn->socks_proxy).passwd);
    (conn->socks_proxy).passwd = (char *)0x0;
    (conn->http_proxy).user = (old_conn->http_proxy).user;
    (conn->socks_proxy).user = (old_conn->socks_proxy).user;
    (conn->http_proxy).passwd = (old_conn->http_proxy).passwd;
    (conn->socks_proxy).passwd = (old_conn->socks_proxy).passwd;
    (old_conn->socks_proxy).user = (char *)0x0;
    (old_conn->socks_proxy).passwd = (char *)0x0;
    (old_conn->http_proxy).user = (char *)0x0;
    (old_conn->http_proxy).passwd = (char *)0x0;
  }
  (*Curl_cfree)((conn->host).rawalloc);
  (conn->host).rawalloc = (char *)0x0;
  (*Curl_cfree)((conn->conn_to_host).rawalloc);
  (conn->conn_to_host).rawalloc = (char *)0x0;
  pcVar9 = (old_conn->host).rawalloc;
  pcVar10 = (old_conn->host).encalloc;
  pcVar11 = (old_conn->host).dispname;
  (conn->host).name = (old_conn->host).name;
  (conn->host).dispname = pcVar11;
  (conn->host).rawalloc = pcVar9;
  (conn->host).encalloc = pcVar10;
  (old_conn->host).rawalloc = (char *)0x0;
  (old_conn->host).encalloc = (char *)0x0;
  uVar2 = *(undefined4 *)&(old_conn->conn_to_host).rawalloc;
  uVar3 = *(undefined4 *)((long)&(old_conn->conn_to_host).rawalloc + 4);
  uVar4 = *(undefined4 *)&(old_conn->conn_to_host).encalloc;
  uVar5 = *(undefined4 *)((long)&(old_conn->conn_to_host).encalloc + 4);
  uVar6 = *(undefined4 *)((long)&(old_conn->conn_to_host).name + 4);
  uVar7 = *(undefined4 *)&(old_conn->conn_to_host).dispname;
  uVar8 = *(undefined4 *)((long)&(old_conn->conn_to_host).dispname + 4);
  *(undefined4 *)&(conn->conn_to_host).name = *(undefined4 *)&(old_conn->conn_to_host).name;
  *(undefined4 *)((long)&(conn->conn_to_host).name + 4) = uVar6;
  *(undefined4 *)&(conn->conn_to_host).dispname = uVar7;
  *(undefined4 *)((long)&(conn->conn_to_host).dispname + 4) = uVar8;
  *(undefined4 *)&(conn->conn_to_host).rawalloc = uVar2;
  *(undefined4 *)((long)&(conn->conn_to_host).rawalloc + 4) = uVar3;
  *(undefined4 *)&(conn->conn_to_host).encalloc = uVar4;
  *(undefined4 *)((long)&(conn->conn_to_host).encalloc + 4) = uVar5;
  (old_conn->conn_to_host).rawalloc = (char *)0x0;
  conn->conn_to_port = old_conn->conn_to_port;
  conn->remote_port = old_conn->remote_port;
  (*Curl_cfree)(conn->hostname_resolve);
  conn->hostname_resolve = (char *)0x0;
  conn->hostname_resolve = old_conn->hostname_resolve;
  old_conn->hostname_resolve = (char *)0x0;
  if (conn->transport == '\x03') {
    Curl_conninfo_local(data,conn->sock[0],local_68,&local_6c);
  }
  Curl_persistconninfo(data,conn,local_68,local_6c);
  puVar1 = &(conn->bits).field_0x4;
  *puVar1 = *puVar1 | 0x80;
  conn_free(old_conn);
  return;
}

Assistant:

static void reuse_conn(struct Curl_easy *data,
                       struct connectdata *old_conn,
                       struct connectdata *conn)
{
  /* 'local_ip' and 'local_port' get filled with local's numerical
     ip address and port number whenever an outgoing connection is
     **established** from the primary socket to a remote address. */
  char local_ip[MAX_IPADR_LEN] = "";
  int local_port = -1;

  /* get the user+password information from the old_conn struct since it may
   * be new for this request even when we re-use an existing connection */
  if(old_conn->user) {
    /* use the new user name and password though */
    Curl_safefree(conn->user);
    Curl_safefree(conn->passwd);
    conn->user = old_conn->user;
    conn->passwd = old_conn->passwd;
    old_conn->user = NULL;
    old_conn->passwd = NULL;
  }

#ifndef CURL_DISABLE_PROXY
  conn->bits.proxy_user_passwd = old_conn->bits.proxy_user_passwd;
  if(conn->bits.proxy_user_passwd) {
    /* use the new proxy user name and proxy password though */
    Curl_safefree(conn->http_proxy.user);
    Curl_safefree(conn->socks_proxy.user);
    Curl_safefree(conn->http_proxy.passwd);
    Curl_safefree(conn->socks_proxy.passwd);
    conn->http_proxy.user = old_conn->http_proxy.user;
    conn->socks_proxy.user = old_conn->socks_proxy.user;
    conn->http_proxy.passwd = old_conn->http_proxy.passwd;
    conn->socks_proxy.passwd = old_conn->socks_proxy.passwd;
    old_conn->http_proxy.user = NULL;
    old_conn->socks_proxy.user = NULL;
    old_conn->http_proxy.passwd = NULL;
    old_conn->socks_proxy.passwd = NULL;
  }
#endif

  Curl_free_idnconverted_hostname(&conn->host);
  Curl_free_idnconverted_hostname(&conn->conn_to_host);
  Curl_safefree(conn->host.rawalloc);
  Curl_safefree(conn->conn_to_host.rawalloc);
  conn->host = old_conn->host;
  old_conn->host.rawalloc = NULL;
  old_conn->host.encalloc = NULL;
  conn->conn_to_host = old_conn->conn_to_host;
  old_conn->conn_to_host.rawalloc = NULL;
  conn->conn_to_port = old_conn->conn_to_port;
  conn->remote_port = old_conn->remote_port;
  Curl_safefree(conn->hostname_resolve);

  conn->hostname_resolve = old_conn->hostname_resolve;
  old_conn->hostname_resolve = NULL;

  /* persist connection info in session handle */
  if(conn->transport == TRNSPRT_TCP) {
    Curl_conninfo_local(data, conn->sock[FIRSTSOCKET],
                        local_ip, &local_port);
  }
  Curl_persistconninfo(data, conn, local_ip, local_port);

  conn_reset_all_postponed_data(old_conn); /* free buffers */

  /* re-use init */
  conn->bits.reuse = TRUE; /* yes, we're re-using here */

  conn_free(old_conn);
}